

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall
CryptoUtil_ConvertSignatureToDerEmpty_Test::CryptoUtil_ConvertSignatureToDerEmpty_Test
          (CryptoUtil_ConvertSignatureToDerEmpty_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00450d30;
  return;
}

Assistant:

TEST(CryptoUtil, ConvertSignatureToDerEmpty) {
  try {
    ByteData empty_data;
    SigHashType sig_type(SigHashAlgorithm::kSigHashAll);
    ByteData byte_data = CryptoUtil::ConvertSignatureToDer(empty_data, sig_type);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "der encode error.");
    return;
  }
  ASSERT_TRUE(false);
}